

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::FillCMakeSystemVariablePath(cmFindBase *this)

{
  cmMakefile *pcVar1;
  cmSearchPath *pcVar2;
  bool bVar3;
  string *this_00;
  char *base;
  bool local_302;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  cmAlphaNum local_298;
  cmAlphaNum local_268;
  undefined1 local_238 [8];
  string var;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  string_view local_178;
  undefined1 local_168 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  string local_148;
  cmValue local_128;
  cmValue prefix_paths;
  string local_118;
  undefined1 local_f8 [8];
  entry_to_remove staging_entry;
  string local_c8;
  undefined1 local_a8 [8];
  entry_to_remove install_entry;
  string local_78;
  byte local_56;
  byte local_55;
  bool add_install_prefix;
  bool remove_install_prefix;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  mapped_type *pmStack_18;
  bool install_prefix_in_list;
  cmSearchPath *paths;
  cmFindBase *this_local;
  
  paths = (cmSearchPath *)this;
  pmStack_18 = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &cmFindCommon::PathLabel::CMakeSystem);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_FIND_NO_INSTALL_PREFIX",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = (bVar3 ^ 0xffU) & 1;
  local_55 = (this->super_cmFindCommon).NoCMakeInstallPath & 1;
  install_entry.value.field_2._M_local_buf[0xe] = '\0';
  install_entry.value.field_2._M_local_buf[0xd] = '\0';
  local_302 = false;
  if (((this->super_cmFindCommon).NoCMakeInstallPath & 1U) == 0) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    install_entry.value.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_FIND_USE_INSTALL_PREFIX",
               (allocator<char> *)(install_entry.value.field_2._M_local_buf + 0xf));
    install_entry.value.field_2._M_local_buf[0xd] = '\x01';
    local_302 = cmMakefile::IsDefinitionSet(pcVar1,&local_78);
  }
  if ((install_entry.value.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((install_entry.value.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(install_entry.value.field_2._M_local_buf + 0xf));
  }
  local_56 = local_302;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"INSTALL",
             (allocator<char> *)(staging_entry.value.field_2._M_local_buf + 0xf));
  anon_unknown.dwarf_11f4085::entry_to_remove::entry_to_remove
            ((entry_to_remove *)local_a8,&local_c8,(this->super_cmFindCommon).Makefile);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(staging_entry.value.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"STAGING",(allocator<char> *)((long)&prefix_paths.Value + 7));
  anon_unknown.dwarf_11f4085::entry_to_remove::entry_to_remove
            ((entry_to_remove *)local_f8,&local_118,(this->super_cmFindCommon).Makefile);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&prefix_paths.Value + 7));
  if ((((local_55 & 1) == 0) || ((local_19 & 1) == 0)) ||
     ((bVar3 = anon_unknown.dwarf_11f4085::entry_to_remove::valid((entry_to_remove *)local_a8),
      !bVar3 && (bVar3 = anon_unknown.dwarf_11f4085::entry_to_remove::valid
                                   ((entry_to_remove *)local_f8), !bVar3)))) {
    pcVar2 = pmStack_18;
    if (((local_56 & 1) == 0) || ((local_19 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"CMAKE_SYSTEM_PREFIX_PATH",
                 (allocator<char> *)(var.field_2._M_local_buf + 0xf));
      cmSearchPath::AddCMakePrefixPath(pcVar2,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)(var.field_2._M_local_buf + 0xf));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"CMAKE_INSTALL_PREFIX",&local_199);
      cmSearchPath::AddCMakePrefixPath(pcVar2,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      pcVar2 = pmStack_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"CMAKE_STAGING_PREFIX",&local_1c1);
      cmSearchPath::AddCMakePrefixPath(pcVar2,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      pcVar2 = pmStack_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"CMAKE_SYSTEM_PREFIX_PATH",&local_1e9);
      cmSearchPath::AddCMakePrefixPath(pcVar2,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
  }
  else {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"CMAKE_SYSTEM_PREFIX_PATH",
               (allocator<char> *)
               ((long)&expanded.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_128 = cmMakefile::GetDefinition(pcVar1,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&expanded.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = cmValue::operator*[abi_cxx11_(&local_128);
    local_178 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168,local_178,false);
    anon_unknown.dwarf_11f4085::entry_to_remove::remove_self
              ((entry_to_remove *)local_a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168);
    anon_unknown.dwarf_11f4085::entry_to_remove::remove_self
              ((entry_to_remove *)local_f8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168);
    pcVar2 = pmStack_18;
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmFindCommon).Makefile);
    base = (char *)std::__cxx11::string::c_str();
    cmSearchPath::AddPrefixPaths
              (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_168,base);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
  }
  cmAlphaNum::cmAlphaNum(&local_268,"CMAKE_SYSTEM_");
  cmAlphaNum::cmAlphaNum(&local_298,&(this->super_cmFindCommon).CMakePathName);
  cmStrCat<char[6]>((string *)local_238,&local_268,&local_298,(char (*) [6])0xdfa7a3);
  cmSearchPath::AddCMakePath(pmStack_18,(string *)local_238);
  bVar3 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  pcVar2 = pmStack_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"CMAKE_SYSTEM_APPBUNDLE_PATH",&local_2b9);
    cmSearchPath::AddCMakePath(pcVar2,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"CMAKE_SYSTEM_FRAMEWORK_PATH",&local_2e1);
    cmSearchPath::AddCMakePath(pcVar2,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
  }
  cmSearchPath::AddSuffixes(pmStack_18,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)local_238);
  anon_unknown.dwarf_11f4085::entry_to_remove::~entry_to_remove((entry_to_remove *)local_f8);
  anon_unknown.dwarf_11f4085::entry_to_remove::~entry_to_remove((entry_to_remove *)local_a8);
  return;
}

Assistant:

void cmFindBase::FillCMakeSystemVariablePath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake ( likewise for `CMAKE_STAGING_PREFIX` )
  entry_to_remove install_entry("INSTALL", this->Makefile);
  entry_to_remove staging_entry("STAGING", this->Makefile);

  if (remove_install_prefix && install_prefix_in_list &&
      (install_entry.valid() || staging_entry.valid())) {
    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");

    // remove entries from CMAKE_SYSTEM_PREFIX_PATH
    std::vector<std::string> expanded = cmExpandedList(*prefix_paths);
    install_entry.remove_self(expanded);
    staging_entry.remove_self(expanded);

    paths.AddPrefixPaths(expanded,
                         this->Makefile->GetCurrentSourceDirectory().c_str());
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePrefixPath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePrefixPath("CMAKE_STAGING_PREFIX");
    paths.AddCMakePrefixPath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePrefixPath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  std::string var = cmStrCat("CMAKE_SYSTEM_", this->CMakePathName, "_PATH");
  paths.AddCMakePath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");
  } else {
    paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}